

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts3UpdateMethod(sqlite3_vtab *pVtab,int nArg,sqlite3_value **apVal,sqlite_int64 *pRowid)

{
  int iVar1;
  sqlite3_int64 sVar2;
  sqlite3_int64 sVar3;
  sqlite3_value *psStack_58;
  int iLangid;
  sqlite3_value *pNewRowid;
  int bInsertDone;
  int nChng;
  u32 *aSzDel;
  u32 *aSzIns;
  Fts3Table *pFStack_30;
  int rc;
  Fts3Table *p;
  sqlite_int64 *pRowid_local;
  sqlite3_value **apVal_local;
  sqlite3_vtab *psStack_10;
  int nArg_local;
  sqlite3_vtab *pVtab_local;
  
  aSzIns._4_4_ = 0;
  aSzDel = (u32 *)0x0;
  _bInsertDone = (u32 *)0x0;
  pNewRowid._4_4_ = 0;
  pNewRowid._0_4_ = 0;
  pFStack_30 = (Fts3Table *)pVtab;
  p = (Fts3Table *)pRowid;
  pRowid_local = (sqlite_int64 *)apVal;
  apVal_local._4_4_ = nArg;
  psStack_10 = pVtab;
  if (((1 < nArg) && (iVar1 = sqlite3_value_type(*apVal), iVar1 == 5)) &&
     (iVar1 = sqlite3_value_type((sqlite3_value *)pRowid_local[pFStack_30->nColumn + 2]), iVar1 != 5
     )) {
    aSzIns._4_4_ = fts3SpecialInsert(pFStack_30,
                                     (sqlite3_value *)pRowid_local[pFStack_30->nColumn + 2]);
    goto LAB_00203e49;
  }
  if ((1 < apVal_local._4_4_) &&
     (iVar1 = sqlite3_value_int((sqlite3_value *)pRowid_local[pFStack_30->nColumn + 4]), iVar1 < 0))
  {
    aSzIns._4_4_ = 0x13;
    goto LAB_00203e49;
  }
  _bInsertDone = (u32 *)sqlite3_malloc64(((long)pFStack_30->nColumn + 1) * 8);
  if (_bInsertDone == (u32 *)0x0) {
    aSzIns._4_4_ = 7;
    goto LAB_00203e49;
  }
  aSzDel = _bInsertDone + (pFStack_30->nColumn + 1);
  memset(_bInsertDone,0,(long)(pFStack_30->nColumn + 1) << 3);
  aSzIns._4_4_ = fts3Writelock(pFStack_30);
  if (aSzIns._4_4_ != 0) goto LAB_00203e49;
  if ((1 < apVal_local._4_4_) && (pFStack_30->zContentTbl == (char *)0x0)) {
    psStack_58 = (sqlite3_value *)pRowid_local[pFStack_30->nColumn + 3];
    iVar1 = sqlite3_value_type(psStack_58);
    if (iVar1 == 5) {
      psStack_58 = (sqlite3_value *)pRowid_local[1];
    }
    iVar1 = sqlite3_value_type(psStack_58);
    if (iVar1 != 5) {
      iVar1 = sqlite3_value_type((sqlite3_value *)*pRowid_local);
      if (iVar1 != 5) {
        sVar2 = sqlite3_value_int64((sqlite3_value *)*pRowid_local);
        sVar3 = sqlite3_value_int64(psStack_58);
        if (sVar2 == sVar3) goto LAB_00203d20;
      }
      iVar1 = sqlite3_vtab_on_conflict(pFStack_30->db);
      if (iVar1 == 5) {
        aSzIns._4_4_ = fts3DeleteByRowid(pFStack_30,psStack_58,(int *)((long)&pNewRowid + 4),
                                         _bInsertDone);
      }
      else {
        aSzIns._4_4_ = fts3InsertData(pFStack_30,(sqlite3_value **)pRowid_local,(sqlite3_int64 *)p);
        pNewRowid._0_4_ = 1;
      }
    }
  }
LAB_00203d20:
  if (aSzIns._4_4_ == 0) {
    iVar1 = sqlite3_value_type((sqlite3_value *)*pRowid_local);
    if (iVar1 != 5) {
      aSzIns._4_4_ = fts3DeleteByRowid(pFStack_30,(sqlite3_value *)*pRowid_local,
                                       (int *)((long)&pNewRowid + 4),_bInsertDone);
    }
    if ((1 < apVal_local._4_4_) && (aSzIns._4_4_ == 0)) {
      iVar1 = sqlite3_value_int((sqlite3_value *)pRowid_local[pFStack_30->nColumn + 4]);
      if (((int)pNewRowid == 0) &&
         ((aSzIns._4_4_ = fts3InsertData(pFStack_30,(sqlite3_value **)pRowid_local,
                                         (sqlite3_int64 *)p), aSzIns._4_4_ == 0x13 &&
          (pFStack_30->zContentTbl == (char *)0x0)))) {
        aSzIns._4_4_ = 0x10b;
      }
      if (aSzIns._4_4_ == 0) {
        aSzIns._4_4_ = fts3PendingTermsDocid(pFStack_30,0,iVar1,(sqlite_int64)(p->base).pModule);
      }
      if (aSzIns._4_4_ == 0) {
        aSzIns._4_4_ = fts3InsertTerms(pFStack_30,iVar1,(sqlite3_value **)pRowid_local,aSzDel);
      }
      if (pFStack_30->bHasDocsize != '\0') {
        fts3InsertDocsize((int *)((long)&aSzIns + 4),pFStack_30,aSzDel);
      }
      pNewRowid._4_4_ = pNewRowid._4_4_ + 1;
    }
    if (pFStack_30->bFts4 != '\0') {
      fts3UpdateDocTotals((int *)((long)&aSzIns + 4),pFStack_30,aSzDel,_bInsertDone,pNewRowid._4_4_)
      ;
    }
  }
LAB_00203e49:
  sqlite3_free(_bInsertDone);
  sqlite3Fts3SegmentsClose(pFStack_30);
  return aSzIns._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3UpdateMethod(
  sqlite3_vtab *pVtab,            /* FTS3 vtab object */
  int nArg,                       /* Size of argument array */
  sqlite3_value **apVal,          /* Array of arguments */
  sqlite_int64 *pRowid            /* OUT: The affected (or effected) rowid */
){
  Fts3Table *p = (Fts3Table *)pVtab;
  int rc = SQLITE_OK;             /* Return Code */
  u32 *aSzIns = 0;                /* Sizes of inserted documents */
  u32 *aSzDel = 0;                /* Sizes of deleted documents */
  int nChng = 0;                  /* Net change in number of documents */
  int bInsertDone = 0;

  /* At this point it must be known if the %_stat table exists or not.
  ** So bHasStat may not be 2.  */
  assert( p->bHasStat==0 || p->bHasStat==1 );

  assert( p->pSegments==0 );
  assert( 
      nArg==1                     /* DELETE operations */
   || nArg==(2 + p->nColumn + 3)  /* INSERT or UPDATE operations */
  );

  /* Check for a "special" INSERT operation. One of the form:
  **
  **   INSERT INTO xyz(xyz) VALUES('command');
  */
  if( nArg>1 
   && sqlite3_value_type(apVal[0])==SQLITE_NULL 
   && sqlite3_value_type(apVal[p->nColumn+2])!=SQLITE_NULL 
  ){
    rc = fts3SpecialInsert(p, apVal[p->nColumn+2]);
    goto update_out;
  }

  if( nArg>1 && sqlite3_value_int(apVal[2 + p->nColumn + 2])<0 ){
    rc = SQLITE_CONSTRAINT;
    goto update_out;
  }

  /* Allocate space to hold the change in document sizes */
  aSzDel = sqlite3_malloc64(sizeof(aSzDel[0])*((sqlite3_int64)p->nColumn+1)*2);
  if( aSzDel==0 ){
    rc = SQLITE_NOMEM;
    goto update_out;
  }
  aSzIns = &aSzDel[p->nColumn+1];
  memset(aSzDel, 0, sizeof(aSzDel[0])*(p->nColumn+1)*2);

  rc = fts3Writelock(p);
  if( rc!=SQLITE_OK ) goto update_out;

  /* If this is an INSERT operation, or an UPDATE that modifies the rowid
  ** value, then this operation requires constraint handling.
  **
  ** If the on-conflict mode is REPLACE, this means that the existing row
  ** should be deleted from the database before inserting the new row. Or,
  ** if the on-conflict mode is other than REPLACE, then this method must
  ** detect the conflict and return SQLITE_CONSTRAINT before beginning to
  ** modify the database file.
  */
  if( nArg>1 && p->zContentTbl==0 ){
    /* Find the value object that holds the new rowid value. */
    sqlite3_value *pNewRowid = apVal[3+p->nColumn];
    if( sqlite3_value_type(pNewRowid)==SQLITE_NULL ){
      pNewRowid = apVal[1];
    }

    if( sqlite3_value_type(pNewRowid)!=SQLITE_NULL && ( 
        sqlite3_value_type(apVal[0])==SQLITE_NULL
     || sqlite3_value_int64(apVal[0])!=sqlite3_value_int64(pNewRowid)
    )){
      /* The new rowid is not NULL (in this case the rowid will be
      ** automatically assigned and there is no chance of a conflict), and 
      ** the statement is either an INSERT or an UPDATE that modifies the
      ** rowid column. So if the conflict mode is REPLACE, then delete any
      ** existing row with rowid=pNewRowid. 
      **
      ** Or, if the conflict mode is not REPLACE, insert the new record into 
      ** the %_content table. If we hit the duplicate rowid constraint (or any
      ** other error) while doing so, return immediately.
      **
      ** This branch may also run if pNewRowid contains a value that cannot
      ** be losslessly converted to an integer. In this case, the eventual 
      ** call to fts3InsertData() (either just below or further on in this
      ** function) will return SQLITE_MISMATCH. If fts3DeleteByRowid is 
      ** invoked, it will delete zero rows (since no row will have
      ** docid=$pNewRowid if $pNewRowid is not an integer value).
      */
      if( sqlite3_vtab_on_conflict(p->db)==SQLITE_REPLACE ){
        rc = fts3DeleteByRowid(p, pNewRowid, &nChng, aSzDel);
      }else{
        rc = fts3InsertData(p, apVal, pRowid);
        bInsertDone = 1;
      }
    }
  }
  if( rc!=SQLITE_OK ){
    goto update_out;
  }

  /* If this is a DELETE or UPDATE operation, remove the old record. */
  if( sqlite3_value_type(apVal[0])!=SQLITE_NULL ){
    assert( sqlite3_value_type(apVal[0])==SQLITE_INTEGER );
    rc = fts3DeleteByRowid(p, apVal[0], &nChng, aSzDel);
  }
  
  /* If this is an INSERT or UPDATE operation, insert the new record. */
  if( nArg>1 && rc==SQLITE_OK ){
    int iLangid = sqlite3_value_int(apVal[2 + p->nColumn + 2]);
    if( bInsertDone==0 ){
      rc = fts3InsertData(p, apVal, pRowid);
      if( rc==SQLITE_CONSTRAINT && p->zContentTbl==0 ){
        rc = FTS_CORRUPT_VTAB;
      }
    }
    if( rc==SQLITE_OK ){
      rc = fts3PendingTermsDocid(p, 0, iLangid, *pRowid);
    }
    if( rc==SQLITE_OK ){
      assert( p->iPrevDocid==*pRowid );
      rc = fts3InsertTerms(p, iLangid, apVal, aSzIns);
    }
    if( p->bHasDocsize ){
      fts3InsertDocsize(&rc, p, aSzIns);
    }
    nChng++;
  }

  if( p->bFts4 ){
    fts3UpdateDocTotals(&rc, p, aSzIns, aSzDel, nChng);
  }

 update_out:
  sqlite3_free(aSzDel);
  sqlite3Fts3SegmentsClose(p);
  return rc;
}